

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O3

void __thiscall QFont::setCapitalization(QFont *this,Capitalization caps)

{
  byte *pbVar1;
  QFontPrivate *pQVar2;
  
  if (((this->resolve_mask & 0x1000) == 0) ||
     ((*(uint *)&((this->d).d.ptr)->field_0x7c >> 4 & (Capitalize|SmallCaps)) != caps)) {
    QFontPrivate::detachButKeepEngineData(this);
    pQVar2 = (this->d).d.ptr;
    pQVar2->field_0x7c = pQVar2->field_0x7c & 0x8f | ((byte)caps & 7) << 4;
    pbVar1 = (byte *)((long)&this->resolve_mask + 1);
    *pbVar1 = *pbVar1 | 0x10;
  }
  return;
}

Assistant:

void QFont::setCapitalization(Capitalization caps)
{
    if ((resolve_mask & QFont::CapitalizationResolved) &&
        capitalization() == caps)
        return;

    QFontPrivate::detachButKeepEngineData(this);

    d->capital = caps;
    resolve_mask |= QFont::CapitalizationResolved;
}